

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

PackageSymbol * __thiscall slang::ast::WildcardImportSymbol::getPackage(WildcardImportSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *this_00;
  PackageImportItemSyntax *pPVar2;
  SourceLocation lookupScope;
  PackageSymbol *pPVar3;
  SourceLocation in_R8;
  string_view packageName;
  
  if ((this->package).super__Optional_base<const_slang::ast::PackageSymbol_*,_true,_true>._M_payload
      .super__Optional_payload_base<const_slang::ast::PackageSymbol_*>._M_engaged == false) {
    pSVar1 = (this->super_Symbol).parentScope;
    if (pSVar1 == (Scope *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x86,"const PackageSymbol *slang::ast::WildcardImportSymbol::getPackage() const");
    }
    this_00 = (this->super_Symbol).originatingSyntax;
    if (this_00 == (SyntaxNode *)0x0) {
      lookupScope = (this->super_Symbol).location;
    }
    else {
      pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::PackageImportItemSyntax>(this_00);
      lookupScope = parsing::Token::location(&pPVar2->package);
    }
    packageName._M_str = (char *)pSVar1;
    packageName._M_len = (size_t)(this->packageName)._M_str;
    pPVar3 = findPackage((ast *)(this->packageName)._M_len,packageName,(Scope *)lookupScope,in_R8);
    (this->package).super__Optional_base<const_slang::ast::PackageSymbol_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_slang::ast::PackageSymbol_*>._M_payload._M_value = pPVar3;
    (this->package).super__Optional_base<const_slang::ast::PackageSymbol_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_slang::ast::PackageSymbol_*>._M_engaged = true;
  }
  return (this->package).super__Optional_base<const_slang::ast::PackageSymbol_*,_true,_true>.
         _M_payload.super__Optional_payload_base<const_slang::ast::PackageSymbol_*>._M_payload.
         _M_value;
}

Assistant:

const PackageSymbol* WildcardImportSymbol::getPackage() const {
    if (!package) {
        const Scope* scope = getParentScope();
        ASSERT(scope);

        auto loc = location;
        if (auto syntax = getSyntax(); syntax)
            loc = syntax->as<PackageImportItemSyntax>().package.location();

        package = findPackage(packageName, *scope, loc);
    }
    return *package;
}